

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O2

void __thiscall Fl_Preferences::Node::setParent(Node *this,Node *pn)

{
  char *pcVar1;
  
  (this->field_2).parent_ = pn;
  this->next_ = pn->child_;
  pn->child_ = this;
  sprintf(nameBuffer,"%s/%s",pn->path_,this->path_);
  free(this->path_);
  pcVar1 = strdup(nameBuffer);
  this->path_ = pcVar1;
  return;
}

Assistant:

void Fl_Preferences::Node::setParent( Node *pn ) {
  parent_ = pn;
  next_ = pn->child_;
  pn->child_ = this;
  sprintf( nameBuffer, "%s/%s", pn->path_, path_ );
  free( path_ );
  path_ = strdup( nameBuffer );
}